

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O2

void __thiscall
coro_io::multithread_context_pool::multithread_context_pool
          (multithread_context_pool *this,size_t thd_num)

{
  basic_executor_type<std::allocator<void>,_0UL> local_30;
  
  asio::io_context::io_context(&this->ioc_);
  std::make_unique<asio::io_context::work,asio::io_context&>((io_context *)&this->work_);
  local_30.target_ = (uintptr_t)this;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ExecutorWrapper(&this->executor_,&local_30);
  this->thd_num_ = thd_num;
  (this->thds_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->thds_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->thds_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::promise<void>::promise(&this->promise_);
  return;
}

Assistant:

multithread_context_pool(size_t thd_num = std::thread::hardware_concurrency())
      : work_(std::make_unique<asio::io_context::work>(ioc_)),
        executor_(ioc_.get_executor()),
        thd_num_(thd_num) {}